

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

void Wln_NtkCreateRefs(Wln_Ntk_t *p)

{
  int i;
  int f;
  long lVar1;
  
  Wln_NtkCleanRefs(p);
  for (lVar1 = 1; lVar1 < (p->vTypes).nSize; lVar1 = lVar1 + 1) {
    for (f = 0; f < p->vFanins[lVar1].nSize; f = f + 1) {
      i = Wln_ObjFanin(p,(int)lVar1,f);
      if (i != 0) {
        Wln_ObjRefsInc(p,i);
      }
    }
  }
  return;
}

Assistant:

void Wln_NtkCreateRefs( Wln_Ntk_t * p )  
{
    int k, iObj, iFanin;
    Wln_NtkCleanRefs( p );
    Wln_NtkForEachObj( p, iObj )
        Wln_ObjForEachFanin( p, iObj, iFanin, k )
            Wln_ObjRefsInc( p, iFanin );
}